

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_15ef17::SeedFast(CSHA512 *hasher)

{
  long lVar1;
  long in_FS_OFFSET;
  uchar *ptr;
  uchar buffer [32];
  size_t in_stack_ffffffffffffffd8;
  uchar *in_stack_ffffffffffffffe0;
  CSHA512 *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA512::Write(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SeedHardwareFast((CSHA512 *)0x21042e);
  SeedTimestamp((CSHA512 *)0x210437);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedFast(CSHA512& hasher) noexcept
{
    unsigned char buffer[32];

    // Stack pointer to indirectly commit to thread/callstack
    const unsigned char* ptr = buffer;
    hasher.Write((const unsigned char*)&ptr, sizeof(ptr));

    // Hardware randomness is very fast when available; use it always.
    SeedHardwareFast(hasher);

    // High-precision timestamp
    SeedTimestamp(hasher);
}